

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * compute_U_value(string *__return_storage_ptr__,string *user_password,EncryptionData *data)

{
  int iVar1;
  EncryptionData *data_local;
  string *user_password_local;
  
  iVar1 = QPDF::EncryptionData::getR(data);
  if (iVar1 < 3) {
    compute_U_value_R2(__return_storage_ptr__,user_password,data);
  }
  else {
    compute_U_value_R3(__return_storage_ptr__,user_password,data);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
compute_U_value(std::string const& user_password, QPDF::EncryptionData const& data)
{
    if (data.getR() >= 3) {
        return compute_U_value_R3(user_password, data);
    }

    return compute_U_value_R2(user_password, data);
}